

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pb.cpp
# Opt level: O0

void poisbinom(double *p_value_poisbinom,int *I1_l,int *I2_l,int n,int m,uint g)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  int *piVar11;
  long *plVar12;
  void *pvVar13;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int i_2;
  int k_4;
  int k_3;
  int k_2;
  double *CumSum;
  int j_1;
  int k_1;
  int k;
  double **x;
  int i_1;
  int z;
  int j;
  double *p;
  double prod;
  int i;
  double **q;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  int local_4c;
  double local_40;
  int local_34;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ECX + 1);
  uVar8 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  for (local_34 = 0; local_34 < in_ECX + 1; local_34 = local_34 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(in_R8D + 1);
    uVar8 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar8);
    *(void **)((long)pvVar9 + (long)local_34 * 8) = pvVar10;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_R8D + 1);
  uVar8 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar8);
  for (local_4c = 1; local_4c <= in_R8D; local_4c = local_4c + 1) {
    ceil((double)*(int *)(in_RDX + (long)local_4c * 4) / 2.0);
    local_40 = 1.0;
    for (local_54 = 1; local_54 <= in_ECX; local_54 = local_54 + 1) {
      *(undefined8 *)(*(long *)((long)pvVar9 + (long)local_54 * 8) + (long)local_4c * 8) = 0;
      piVar11 = std::min<int>((int *)(in_RSI + (long)local_54 * 4),
                              (int *)(in_RDX + (long)local_4c * 4));
      if (0 < *piVar11) {
        *(double *)(*(long *)((long)pvVar9 + (long)local_54 * 8) + (long)local_4c * 8) =
             (double)(*(int *)(in_RSI + (long)local_54 * 4) + *(int *)(in_RDX + (long)local_4c * 4)
                     + -1);
      }
      *(double *)(*(long *)((long)pvVar9 + (long)local_54 * 8) + (long)local_4c * 8) =
           *(double *)(*(long *)((long)pvVar9 + (long)local_54 * 8) + (long)local_4c * 8) /
           (double)in_R9D;
      local_40 = (1.0 - *(double *)
                         (*(long *)((long)pvVar9 + (long)local_54 * 8) + (long)local_4c * 8)) *
                 local_40;
    }
    *(double *)((long)pvVar10 + (long)local_4c * 8) = 1.0 - local_40;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(in_R8D + 1);
  uVar8 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  plVar12 = (long *)operator_new__(uVar8);
  for (local_64 = 0; local_64 <= in_R8D; local_64 = local_64 + 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(in_R8D + 1);
    uVar8 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar8);
    plVar12[local_64] = (long)pvVar13;
  }
  for (local_68 = 0; local_68 <= in_R8D; local_68 = local_68 + 1) {
    for (local_6c = local_68; local_6c <= in_R8D; local_6c = local_6c + 1) {
      if ((local_68 == 0) && (local_6c == 0)) {
        *(undefined8 *)*plVar12 = 0x3ff0000000000000;
      }
      else if (local_68 == 0) {
        *(double *)(*plVar12 + (long)local_6c * 8) =
             *(double *)(*plVar12 + (long)(local_6c + -1) * 8) *
             (1.0 - *(double *)((long)pvVar10 + (long)local_6c * 8));
      }
      else if (local_68 == local_6c) {
        *(double *)(plVar12[local_68] + (long)local_6c * 8) =
             *(double *)(plVar12[local_68 + -1] + (long)(local_6c + -1) * 8) *
             *(double *)((long)pvVar10 + (long)local_6c * 8);
      }
      else {
        *(double *)(plVar12[local_68] + (long)local_6c * 8) =
             *(double *)(plVar12[local_68] + (long)(local_6c + -1) * 8) *
             (1.0 - *(double *)((long)pvVar10 + (long)local_6c * 8)) +
             *(double *)(plVar12[local_68 + -1] + (long)(local_6c + -1) * 8) *
             *(double *)((long)pvVar10 + (long)local_6c * 8);
      }
    }
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(in_R8D + 1);
  uVar8 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar8);
  for (local_7c = 0; local_7c <= in_R8D; local_7c = local_7c + 1) {
    if (local_7c == 0) {
      *(undefined8 *)((long)pvVar13 + (long)in_R8D * 8) =
           *(undefined8 *)(plVar12[in_R8D] + (long)in_R8D * 8);
    }
    else {
      *(double *)((long)pvVar13 + (long)(in_R8D - local_7c) * 8) =
           *(double *)((long)pvVar13 + (long)((in_R8D - local_7c) + 1) * 8) +
           *(double *)(plVar12[in_R8D - local_7c] + (long)in_R8D * 8);
    }
  }
  for (local_80 = 0; local_80 <= in_R8D; local_80 = local_80 + 1) {
    *(undefined8 *)(in_RDI + (long)local_80 * 8) =
         *(undefined8 *)((long)pvVar13 + (long)local_80 * 8);
  }
  for (local_84 = 0; local_84 <= in_R8D; local_84 = local_84 + 1) {
    if ((void *)plVar12[local_84] != (void *)0x0) {
      operator_delete__((void *)plVar12[local_84]);
    }
  }
  for (local_88 = 0; local_88 < in_ECX + 1; local_88 = local_88 + 1) {
    pvVar1 = *(void **)((long)pvVar9 + (long)local_88 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  if (pvVar10 != (void *)0x0) {
    operator_delete__(pvVar10);
  }
  if (plVar12 != (long *)0x0) {
    operator_delete__(plVar12);
  }
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  return;
}

Assistant:

void poisbinom(double* p_value_poisbinom, int* I1_l, int* I2_l, int n, int m, unsigned int g)
{
    double** q = new double* [n+1];
    for(int i=0; i<n+1; i++)
        q[i] = new double [m+1];
    double prod;
    double* p = new double [m+1];
    for(int j=1; j<=m; j++){
        int z = ceil(double(I2_l[j])/2);
        z = 1;
        prod = 1;
        for(int i=1; i<=n; i++){
            q[i][j] = 0;
            if (z<=min(I1_l[i], I2_l[j]))
                q[i][j] = I1_l[i] + I2_l[j] - 2*z + 1;
            q[i][j] = q[i][j]/g;
            prod *= (1-q[i][j]);
        }
        p[j] = 1-prod;
    }

    double** x = new double* [m+1];
    for(int k=0; k<=m; k++)
       x[k] = new double [m+1];
    for(int k=0; k<=m; k++)
    {
       for(int j=k; j<=m; j++)
       {
            if(k==0 && j==0)
                x[k][j] = 1;
            else if(k==0)
                x[k][j] = x[k][j-1] * (1-p[j]);
            else if(k==j)
                x[k][j] = x[k-1][j-1] * (p[j]);
            else
            {
                x[k][j] = x[k][j-1] * (1-p[j]) + x[k-1][j-1] * (p[j]);
            }

       }
    }
    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++)
    {
        if (k==0)
        {
            CumSum[m] = x[m][m];
        }
        else CumSum[m-k] = CumSum[m-k+1] + x[m-k][m];
    }
    for(int k=0; k<=m; k++)
    {
        p_value_poisbinom[k] = CumSum[k];
    }

    for(int k=0; k<=m; k++)
    {
        delete [] x[k];
    }
    for(int i=0; i<n+1; i++)
        delete [] q[i];
    delete [] q;
    delete [] p;
    delete [] x;
    delete [] CumSum;
}